

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O0

string * __thiscall
Assimp::FBX::MeshGeometry::GetTextureCoordChannelName_abi_cxx11_
          (string *__return_storage_ptr__,MeshGeometry *this,uint index)

{
  allocator local_1d;
  uint local_1c;
  MeshGeometry *pMStack_18;
  uint index_local;
  MeshGeometry *this_local;
  
  local_1c = index;
  pMStack_18 = this;
  this_local = (MeshGeometry *)__return_storage_ptr__;
  if (index < 8) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(&this->field_0x100 + (ulong)index * 0x20)
              );
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MeshGeometry::GetTextureCoordChannelName( unsigned int index ) const {
    return index >= AI_MAX_NUMBER_OF_TEXTURECOORDS ? "" : m_uvNames[ index ];
}